

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O2

MXFWriter * __thiscall
AS_02::JXS::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,
          GenericPictureEssenceDescriptor *picture_descriptor,
          JPEGXSPictureSubDescriptor *jxs_sub_descriptor,Rational *edit_rate,ui32_t *header_size,
          IndexStrategy_t *strategy,ui32_t *partition_space)

{
  h__Writer *this_00;
  Dictionary *d;
  ui32_t *in_stack_00000020;
  
  this_00 = (h__Writer *)operator_new(0x5c0);
  d = (Dictionary *)ASDCP::DefaultSMPTEDict();
  h__Writer::h__Writer(this_00,d);
  if ((long *)filename->_M_string_length != (long *)0x0) {
    (**(code **)(*(long *)filename->_M_string_length + 8))();
  }
  filename->_M_string_length = (size_type)this_00;
  ASDCP::WriterInfo::operator=
            (&(this_00->super_h__AS02WriterFrame).
              super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>.
              super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info,(WriterInfo *)picture_descriptor)
  ;
  h__Writer::OpenWrite
            ((h__Writer *)this,(string *)filename->_M_string_length,
             (GenericPictureEssenceDescriptor *)Info,jxs_sub_descriptor,(IndexStrategy_t *)edit_rate
             ,partition_space,in_stack_00000020);
  if (-1 < *(int *)&this->_vptr_MXFWriter) {
    h__Writer::SetSourceStream
              ((h__Writer *)&stack0xffffffffffffff68,(string *)filename->_M_string_length,
               (Rational *)&JXS_PACKAGE_LABEL_abi_cxx11_);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    if (-1 < *(int *)&this->_vptr_MXFWriter) {
      return this;
    }
  }
  filename->_M_string_length = 0;
  return this;
}

Assistant:

Result_t
AS_02::JXS::MXFWriter::OpenWrite(const std::string& filename, const ASDCP::WriterInfo& Info,
                                 ASDCP::MXF::GenericPictureEssenceDescriptor& picture_descriptor,
                                 ASDCP::MXF::JPEGXSPictureSubDescriptor& jxs_sub_descriptor,
                                 const ASDCP::Rational& edit_rate, const ui32_t& header_size,
                                 const IndexStrategy_t& strategy, const ui32_t& partition_space)
{
  m_Writer = new AS_02::JXS::MXFWriter::h__Writer(&DefaultSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, picture_descriptor, jxs_sub_descriptor,
					strategy, partition_space, header_size);

  if ( KM_SUCCESS(result) )
    result = m_Writer->SetSourceStream(JXS_PACKAGE_LABEL, edit_rate);

  if ( KM_FAILURE(result) )
    m_Writer.release();

  return result;
}